

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void google::protobuf::internal::PackedFieldHelper<7>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  uint *puVar1;
  uint *puVar2;
  int index;
  RepeatedField<unsigned_int> *array;
  uint32_t local_20;
  undefined4 local_1c;
  
  if (*field != 0) {
    local_20 = md->tag;
    OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(&local_20,output);
    local_1c = *(undefined4 *)((long)field + 0x10);
    OutputHelper<google::protobuf::internal::ArrayOutput,_13>::Serialize(&local_1c,output);
    if (0 < *field) {
      index = 0;
      do {
        puVar2 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)field,index);
        puVar1 = (uint *)output->ptr;
        *puVar1 = *puVar2;
        output->ptr = (uint8_t *)(puVar1 + 1);
        index = index + 1;
      } while (index < *field);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}